

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

char * apprun_env_str_entry_extract_value(char *string)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  uint value_len;
  char *sep;
  uint string_len;
  char *string_local;
  
  if ((string != (char *)0x0) && (sVar2 = strlen(string), sVar2 != 0)) {
    sVar2 = strlen(string);
    pcVar3 = strchr(string,0x3d);
    uVar1 = (int)sVar2 - ((int)pcVar3 - (int)string);
    if (1 < uVar1) {
      pcVar3 = strndup(pcVar3 + 1,(ulong)uVar1);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

char *apprun_env_str_entry_extract_value(char *string) {
    if (string && strlen(string) > 0) {
        unsigned string_len = strlen(string);
        char *sep = strchr(string, '=');
        unsigned value_len = string_len - (sep - string);

        // assume empty string value as NULL
        if (value_len > 1)
            return strndup(sep + 1, value_len);
    }

    return NULL;
}